

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O1

void board_moveLinkMake(Board *board,MoveLink *lastLink)

{
  code *pcVar1;
  long lVar2;
  Move *moveLinks [2048];
  undefined8 auStack_4020 [2050];
  long lVar3;
  
  if (lastLink == (MoveLink *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar3 = 0;
    do {
      lVar2 = lVar3 + 1;
      if (SCARRY8(lVar3,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      auStack_4020[lVar3 + 1] = lastLink->move;
      lastLink = lastLink->prev;
      lVar3 = lVar2;
    } while (lastLink != (MoveLink *)0x0);
  }
  if (SBORROW8(lVar2,1)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (-1 < lVar2 + -1) {
    do {
      auStack_4020[0] = 0x1064d1;
      board_moveMake(board,(Move *)auStack_4020[lVar2]);
      lVar2 = lVar2 + -1;
    } while (0 < lVar2);
  }
  return;
}

Assistant:

void board_moveLinkMake(Board * board, MoveLink * lastLink)
{
	Move * moveLinks[2048];
	long i=0;

	while(lastLink)
	{
		moveLinks[i++] = lastLink->move;
		lastLink = lastLink->prev;
	}

	for(--i;i>=0;i--)
	{
		board_moveMake(board, moveLinks[i]);
	}
}